

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

TPZVec<int_*> * __thiscall TPZVec<int_*>::operator=(TPZVec<int_*> *this,TPZVec<int_*> *rval)

{
  int **ppiVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (this != rval) {
    this->fNElements = rval->fNElements;
    if (this->fStore != (int **)0x0) {
      operator_delete__(this->fStore);
    }
    if (rval->fNAlloc == 0) {
      uVar3 = this->fNElements;
      ppiVar1 = (int **)operator_new__(-(ulong)(uVar3 >> 0x3d != 0) | uVar3 * 8);
      this->fStore = ppiVar1;
      if (0 < (long)uVar3) {
        uVar2 = 0;
        do {
          this->fStore[uVar2] = rval->fStore[uVar2];
          uVar2 = uVar2 + 1;
        } while (uVar3 != uVar2);
      }
    }
    else {
      this->fStore = rval->fStore;
      uVar3 = this->fNElements;
    }
    this->fNAlloc = uVar3;
    rval->fStore = (int **)0x0;
    rval->fNElements = 0;
    rval->fNAlloc = 0;
  }
  return this;
}

Assistant:

TPZVec<T> &TPZVec<T>::operator=(TPZVec<T> &&rval){
	if(this != &rval){
        fNElements = rval.fNElements;
        if(fStore) delete [] fStore;
        if(rval.fNAlloc){
            fStore = rval.fStore;
        }else{
            fStore = new T[fNElements];
            for (int64_t i = 0; i < fNElements; i++)
                fStore[i] = rval.fStore[i];
        }
        fNAlloc = fNElements;//perhaps rval.fNalloc was 0
        rval.fStore = nullptr;
        rval.fNElements = 0;
        rval.fNAlloc = 0;
	}
	return *this;
}